

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# end.c
# Opt level: O1

void list_vanquished(char defquery,boolean ask)

{
  nh_menuitem *pnVar1;
  byte bVar2;
  bool bVar3;
  int iVar4;
  boolean bVar5;
  schar *psVar6;
  char *pcVar7;
  long lVar8;
  long lVar9;
  char *pcVar10;
  char *__format;
  permonst *pm;
  uint uVar11;
  ulong uVar12;
  int iVar13;
  menulist menu;
  char buf [256];
  menulist local_158;
  ulong local_148;
  long local_140;
  char local_138 [264];
  
  psVar6 = &mons[0].mlevel;
  uVar12 = 0;
  lVar8 = 1;
  iVar13 = 0;
  lVar9 = 0;
  do {
    uVar11 = ((int)uVar12 + 1) - (uint)((ulong)(&mvitals[0].born)[lVar8] == 0);
    uVar12 = (ulong)uVar11;
    lVar9 = lVar9 + (ulong)(&mvitals[0].born)[lVar8];
    iVar4 = (int)*psVar6;
    if (*psVar6 < iVar13) {
      iVar4 = iVar13;
    }
    iVar13 = iVar4;
    lVar8 = lVar8 + 3;
    psVar6 = psVar6 + 0x40;
  } while (lVar8 != 0x4ba);
  if (uVar11 == 0) {
    return;
  }
  if (ask != '\0') {
    defquery = yn_function("Do you want an account of creatures vanquished?","ynq",defquery);
  }
  if (defquery != 'y') {
    if (defquery != 'q') {
      return;
    }
    program_state.stopprint = program_state.stopprint + 1;
    return;
  }
  local_148 = uVar12;
  local_140 = lVar9;
  init_menulist(&local_158);
  do {
    lVar8 = -0x4b9;
    pm = mons;
    do {
      if ((iVar13 == pm->mlevel) && (bVar2 = *(byte *)(lVar8 + 0x31a4ba), bVar2 != 0)) {
        if ((lVar8 == -0x159) || ((pm->geno & 0x1000) == 0)) {
          pcVar10 = mons_mname(pm);
          if (bVar2 == 1) {
            pcVar10 = an(pcVar10);
            strcpy(local_138,pcVar10);
          }
          else {
            pcVar7 = makeplural(pcVar10);
            __format = "%d %s";
            pcVar10 = local_138;
LAB_00197755:
            sprintf(pcVar10,__format,(ulong)bVar2,pcVar7);
          }
        }
        else {
          pcVar10 = "";
          if ((pm->mflags2 & 0x80000) == 0) {
            pcVar10 = "The ";
          }
          pcVar7 = mons_mname(pm);
          sprintf(local_138,"%s%s",pcVar10,pcVar7);
          if (bVar2 != 1) {
            if (bVar2 == 3) {
              pcVar10 = eos(local_138);
              builtin_strncpy(pcVar10," (thrice)",10);
            }
            else {
              if (bVar2 != 2) {
                pcVar10 = eos(local_138);
                __format = " (%d time%s)";
                pcVar7 = "s";
                goto LAB_00197755;
              }
              pcVar10 = eos(local_138);
              builtin_strncpy(pcVar10," (twice)",9);
            }
          }
        }
        lVar9 = (long)local_158.size;
        if (local_158.size <= local_158.icount) {
          local_158.size = local_158.size * 2;
          local_158.items = (nh_menuitem *)realloc(local_158.items,lVar9 * 0x218);
        }
        pnVar1 = local_158.items + local_158.icount;
        pnVar1->id = 0;
        pnVar1->role = MI_TEXT;
        pnVar1->accel = '\0';
        pnVar1->group_accel = '\0';
        pnVar1->selected = '\0';
        strcpy(pnVar1->caption,local_138);
        local_158.icount = local_158.icount + 1;
      }
      lVar9 = local_140;
      uVar12 = local_148;
      pm = pm + 1;
      lVar8 = lVar8 + 3;
    } while (lVar8 != 0);
    bVar3 = iVar13 < 1;
    iVar13 = iVar13 + -1;
    if (bVar3) {
      if (((u.uprops[0x23].intrinsic != 0) && (u.uprops[0x24].extrinsic == 0)) &&
         ((u.umonnum == u.umonster || (bVar5 = dmgtype(youmonst.data,0x24), bVar5 == '\0')))) {
        lVar8 = (long)local_158.size;
        if (local_158.size <= local_158.icount) {
          local_158.size = local_158.size * 2;
          local_158.items = (nh_menuitem *)realloc(local_158.items,lVar8 * 0x218);
        }
        lVar8 = (long)local_158.icount;
        local_158.items[lVar8].id = 0;
        local_158.items[lVar8].role = MI_TEXT;
        local_158.items[lVar8].accel = '\0';
        local_158.items[lVar8].group_accel = '\0';
        local_158.items[lVar8].selected = '\0';
        builtin_strncpy(local_158.items[lVar8].caption,"and a partridge ",0x10);
        builtin_strncpy(local_158.items[lVar8].caption + 0xf," in a pear tree",0x10);
        local_158.icount = local_158.icount + 1;
      }
      if ((int)uVar12 != 1) {
        lVar8 = (long)local_158.size;
        if (local_158.size <= local_158.icount) {
          local_158.size = local_158.size * 2;
          local_158.items = (nh_menuitem *)realloc(local_158.items,lVar8 * 0x218);
        }
        lVar8 = (long)local_158.icount;
        local_158.items[lVar8].accel = '\0';
        local_158.items[lVar8].group_accel = '\0';
        local_158.items[lVar8].selected = '\0';
        local_158.items[lVar8].caption[0] = '\0';
        local_158.items[lVar8].id = 0;
        local_158.items[lVar8].role = MI_TEXT;
        local_158.icount = local_158.icount + 1;
        sprintf(local_138,"%ld creatures vanquished.",lVar9);
        lVar8 = (long)local_158.size;
        if (local_158.size <= local_158.icount) {
          local_158.size = local_158.size * 2;
          local_158.items = (nh_menuitem *)realloc(local_158.items,lVar8 * 0x218);
        }
        pnVar1 = local_158.items + local_158.icount;
        pnVar1->id = 0;
        pnVar1->role = MI_TEXT;
        pnVar1->accel = '\0';
        pnVar1->group_accel = '\0';
        pnVar1->selected = '\0';
        strcpy(pnVar1->caption,local_138);
        local_158.icount = local_158.icount + 1;
      }
      display_menu(local_158.items,local_158.icount,"Vanquished creatures:",0,(int *)0x0);
      free(local_158.items);
      return;
    }
  } while( true );
}

Assistant:

void list_vanquished(char defquery, boolean ask)
{
    int i, lev;
    int ntypes = 0, max_lev = 0, nkilled;
    long total_killed = 0L;
    char c;
    char buf[BUFSZ];
    struct menulist menu;

    /* get totals first */
    for (i = LOW_PM; i < NUMMONS; i++) {
	if (mvitals[i].died) ntypes++;
	total_killed += (long)mvitals[i].died;
	if (mons[i].mlevel > max_lev) max_lev = mons[i].mlevel;
    }

    /* vanquished creatures list;
     * includes all dead monsters, not just those killed by the player
     */
    if (ntypes != 0) {
	c = ask ? yn_function("Do you want an account of creatures vanquished?",
			      ynqchars, defquery) : defquery;
	if (c == 'q') done_stopprint++;
	if (c == 'y') {
	    init_menulist(&menu);

	    /* countdown by monster "toughness" */
	    for (lev = max_lev; lev >= 0; lev--)
	      for (i = LOW_PM; i < NUMMONS; i++)
		if (mons[i].mlevel == lev && (nkilled = mvitals[i].died) > 0) {
		    if ((mons[i].geno & G_UNIQ) && i != PM_HIGH_PRIEST) {
			sprintf(buf, "%s%s",
				!type_is_pname(&mons[i]) ? "The " : "",
				mons_mname(&mons[i]));
			if (nkilled > 1) {
			    switch (nkilled) {
				case 2:  sprintf(eos(buf)," (twice)");  break;
				case 3:  sprintf(eos(buf)," (thrice)");  break;
				default: sprintf(eos(buf)," (%d time%s)",
						 nkilled, plur(nkilled));
					 break;
			    }
			}
		    } else {
			/* trolls or undead might have come back,
			   but we don't keep track of that */
			if (nkilled == 1)
			    strcpy(buf, an(mons_mname(&mons[i])));
			else
			    sprintf(buf, "%d %s",
				    nkilled, makeplural(mons_mname(&mons[i])));
		    }
		    add_menutext(&menu,  buf);
		}

	    if (Hallucination)
		add_menutext(&menu, "and a partridge in a pear tree");

	    if (ntypes > 1) {
		add_menutext(&menu,  "");
		sprintf(buf, "%ld creatures vanquished.", total_killed);
		add_menutext(&menu,  buf);
	    }
	    display_menu(menu.items, menu.icount, "Vanquished creatures:", PICK_NONE, NULL);
	    free(menu.items);
	}
    }
}